

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void GetNotHEV_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int hev_thresh,__m128i *not_hev)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined1 uVar4;
  byte bVar5;
  undefined1 uVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  undefined1 auVar10 [16];
  byte bVar25;
  undefined1 auVar26 [16];
  
  auVar10 = psubusb((undefined1  [16])*p0,(undefined1  [16])*p1);
  auVar8 = psubusb((undefined1  [16])*p1,(undefined1  [16])*p0);
  auVar8 = auVar8 | auVar10;
  auVar26 = psubusb((undefined1  [16])*q0,(undefined1  [16])*q1);
  auVar10 = psubusb((undefined1  [16])*q1,(undefined1  [16])*q0);
  auVar10 = auVar10 | auVar26;
  bVar1 = auVar8[0];
  bVar3 = auVar10[0];
  bVar9 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[1];
  bVar3 = auVar10[1];
  bVar11 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[2];
  bVar3 = auVar10[2];
  bVar12 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[3];
  bVar3 = auVar10[3];
  bVar13 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[4];
  bVar3 = auVar10[4];
  bVar14 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[5];
  bVar3 = auVar10[5];
  bVar15 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[6];
  bVar3 = auVar10[6];
  bVar16 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[7];
  bVar3 = auVar10[7];
  bVar17 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[8];
  bVar3 = auVar10[8];
  bVar18 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[9];
  bVar3 = auVar10[9];
  bVar19 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[10];
  bVar3 = auVar10[10];
  bVar20 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[0xb];
  bVar3 = auVar10[0xb];
  bVar21 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[0xc];
  bVar3 = auVar10[0xc];
  bVar22 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[0xd];
  bVar3 = auVar10[0xd];
  bVar23 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[0xe];
  bVar3 = auVar10[0xe];
  bVar5 = auVar10[0xf];
  bVar24 = (bVar3 < bVar1) * bVar1 | (bVar3 >= bVar1) * bVar3;
  bVar1 = auVar8[0xf];
  bVar25 = (bVar5 < bVar1) * bVar1 | (bVar5 >= bVar1) * bVar5;
  uVar6 = (undefined1)((uint)hev_thresh >> 0x18);
  uVar4 = (undefined1)((uint)hev_thresh >> 0x10);
  uVar2 = (undefined1)((uint)hev_thresh >> 8);
  auVar8._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar6,uVar6),uVar4),CONCAT14(uVar4,hev_thresh)) >>
                      0x20);
  auVar8[3] = uVar2;
  auVar8[2] = uVar2;
  auVar8[0] = (undefined1)hev_thresh;
  auVar8[1] = auVar8[0];
  auVar8._8_8_ = 0;
  auVar8 = pshuflw(auVar8,auVar8,0);
  bVar1 = auVar8[0];
  bVar3 = auVar8[1];
  bVar5 = auVar8[2];
  bVar7 = auVar8[3];
  *(char *)*not_hev = -((byte)((bVar9 < bVar1) * bVar9 | (bVar9 >= bVar1) * bVar1) == bVar9);
  *(char *)((long)*not_hev + 1) =
       -((byte)((bVar11 < bVar3) * bVar11 | (bVar11 >= bVar3) * bVar3) == bVar11);
  *(char *)((long)*not_hev + 2) =
       -((byte)((bVar12 < bVar5) * bVar12 | (bVar12 >= bVar5) * bVar5) == bVar12);
  *(char *)((long)*not_hev + 3) =
       -((byte)((bVar13 < bVar7) * bVar13 | (bVar13 >= bVar7) * bVar7) == bVar13);
  *(char *)((long)*not_hev + 4) =
       -((byte)((bVar14 < bVar1) * bVar14 | (bVar14 >= bVar1) * bVar1) == bVar14);
  *(char *)((long)*not_hev + 5) =
       -((byte)((bVar15 < bVar3) * bVar15 | (bVar15 >= bVar3) * bVar3) == bVar15);
  *(char *)((long)*not_hev + 6) =
       -((byte)((bVar16 < bVar5) * bVar16 | (bVar16 >= bVar5) * bVar5) == bVar16);
  *(char *)((long)*not_hev + 7) =
       -((byte)((bVar17 < bVar7) * bVar17 | (bVar17 >= bVar7) * bVar7) == bVar17);
  *(char *)(*not_hev + 1) =
       -((byte)((bVar18 < bVar1) * bVar18 | (bVar18 >= bVar1) * bVar1) == bVar18);
  *(char *)((long)*not_hev + 9) =
       -((byte)((bVar19 < bVar3) * bVar19 | (bVar19 >= bVar3) * bVar3) == bVar19);
  *(char *)((long)*not_hev + 10) =
       -((byte)((bVar20 < bVar5) * bVar20 | (bVar20 >= bVar5) * bVar5) == bVar20);
  *(char *)((long)*not_hev + 0xb) =
       -((byte)((bVar21 < bVar7) * bVar21 | (bVar21 >= bVar7) * bVar7) == bVar21);
  *(char *)((long)*not_hev + 0xc) =
       -((byte)((bVar22 < bVar1) * bVar22 | (bVar22 >= bVar1) * bVar1) == bVar22);
  *(char *)((long)*not_hev + 0xd) =
       -((byte)((bVar23 < bVar3) * bVar23 | (bVar23 >= bVar3) * bVar3) == bVar23);
  *(char *)((long)*not_hev + 0xe) =
       -((byte)((bVar24 < bVar5) * bVar24 | (bVar24 >= bVar5) * bVar5) == bVar24);
  *(char *)((long)*not_hev + 0xf) =
       -((byte)((bVar25 < bVar7) * bVar25 | (bVar25 >= bVar7) * bVar7) == bVar25);
  return;
}

Assistant:

static WEBP_INLINE void GetNotHEV_SSE2(const __m128i* const p1,
                                       const __m128i* const p0,
                                       const __m128i* const q0,
                                       const __m128i* const q1,
                                       int hev_thresh, __m128i* const not_hev) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i t_1 = MM_ABS(*p1, *p0);
  const __m128i t_2 = MM_ABS(*q1, *q0);

  const __m128i h = _mm_set1_epi8(hev_thresh);
  const __m128i t_max = _mm_max_epu8(t_1, t_2);

  const __m128i t_max_h = _mm_subs_epu8(t_max, h);
  *not_hev = _mm_cmpeq_epi8(t_max_h, zero);  // not_hev <= t1 && not_hev <= t2
}